

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathEvaluatePredicateResult(xmlXPathParserContextPtr ctxt,xmlXPathObjectPtr res)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar1 = 0;
  iVar2 = 0;
  if (res != (xmlXPathObjectPtr)0x0 && ctxt != (xmlXPathParserContextPtr)0x0) {
    iVar2 = iVar1;
    switch(res->type) {
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      if (res->nodesetval != (xmlNodeSetPtr)0x0) {
        bVar3 = res->nodesetval->nodeNr == 0;
LAB_001c0ff3:
        return (int)!bVar3;
      }
      break;
    case XPATH_BOOLEAN:
      iVar2 = res->boolval;
      break;
    case XPATH_NUMBER:
      return -(uint)((double)ctxt->context->proximityPosition == res->floatval) & 1;
    case XPATH_STRING:
      if (res->stringval != (xmlChar *)0x0) {
        bVar3 = *res->stringval == '\0';
        goto LAB_001c0ff3;
      }
    }
  }
  return iVar2;
}

Assistant:

int
xmlXPathEvaluatePredicateResult(xmlXPathParserContextPtr ctxt,
                                xmlXPathObjectPtr res) {
    if ((ctxt == NULL) || (res == NULL)) return(0);
    switch (res->type) {
        case XPATH_BOOLEAN:
	    return(res->boolval);
        case XPATH_NUMBER:
#if defined(__BORLANDC__) || (defined(_MSC_VER) && (_MSC_VER == 1200))
	    return((res->floatval == ctxt->context->proximityPosition) &&
	           (!xmlXPathIsNaN(res->floatval))); /* MSC pbm Mark Vakoc !*/
#else
	    return(res->floatval == ctxt->context->proximityPosition);
#endif
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
	    if (res->nodesetval == NULL)
		return(0);
	    return(res->nodesetval->nodeNr != 0);
        case XPATH_STRING:
	    return((res->stringval != NULL) && (res->stringval[0] != 0));
        default:
	    break;
    }
    return(0);
}